

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayGet(PrintExpressionContents *this,ArrayGet *curr)

{
  ostream *poVar1;
  bool bVar2;
  HeapType type;
  bool bVar3;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  BasicType local_3c;
  uintptr_t local_38;
  HeapType local_30 [2];
  Type *local_20;
  Field *element;
  ArrayGet *curr_local;
  PrintExpressionContents *this_local;
  
  element = (Field *)curr;
  curr_local = (ArrayGet *)this;
  local_38 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
  HeapType::getArray(local_30);
  local_20 = (Type *)local_30;
  local_3c = i32;
  bVar2 = wasm::Type::operator==(local_20,&local_3c);
  bVar3 = false;
  if (bVar2) {
    bVar3 = (int)local_20[1].id != 0;
  }
  if (bVar3) {
    if ((element[2].type.id & 1) == 0) {
      poVar1 = this->o;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_60,"array.get_u ");
      printMedium(poVar1,local_60);
    }
    else {
      poVar1 = this->o;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,"array.get_s ");
      printMedium(poVar1,local_50);
    }
  }
  else {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"array.get ")
    ;
    printMedium(poVar1,local_70);
  }
  type = wasm::Type::getHeapType((Type *)(element[1].type.id + 8));
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    const auto& element = curr->ref->type.getHeapType().getArray().element;
    if (element.type == Type::i32 && element.packedType != Field::not_packed) {
      if (curr->signed_) {
        printMedium(o, "array.get_s ");
      } else {
        printMedium(o, "array.get_u ");
      }
    } else {
      printMedium(o, "array.get ");
    }
    printHeapTypeName(curr->ref->type.getHeapType());
  }